

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeStElem(GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  ObjectType OVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  BailOutKind BVar8;
  BailOutKind BVar9;
  Opnd *pOVar10;
  IndirOpnd *pIVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  ValueInfo *pVVar16;
  undefined4 *puVar17;
  RegOpnd *pRVar18;
  GlobOptBlockData *pGVar19;
  char16_t *pcVar20;
  bool local_7c9;
  StackSym *local_770;
  char local_738 [8];
  char baseValueTypeStr_4 [256];
  char16 debugStringBuffer_4 [42];
  int local_5d8;
  BailOutKind oldBailOutKind;
  int32 max;
  int32 min;
  char local_5c8 [3];
  bool bConvertToBailoutInstr;
  BailOutKind bailOutKind;
  char baseValueTypeStr_3 [256];
  char16 debugStringBuffer_3 [42];
  bool local_46a;
  IRType local_469;
  BailOutKind arrayBailOutKind;
  bool isLossyAllowed;
  IRType toType;
  char baseValueTypeStr_2 [256];
  char16 debugStringBuffer_2 [42];
  IndirOpnd *dst;
  char local_2f8 [4];
  int32 src1IntConstantValue;
  char baseValueTypeStr_1 [256];
  char16 debugStringBuffer_1 [42];
  StackSym *sym;
  char baseValueTypeStr [256];
  char16 debugStringBuffer [42];
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Instr **instr;
  Value **pDstVal_local;
  Value *src1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  pOVar10 = IR::Instr::GetDst(*pInstr);
  pIVar11 = IR::Opnd::AsIndirOpnd(pOVar10);
  register0x00000000 = IR::IndirOpnd::GetBaseOpnd(pIVar11);
  debugStringBuffer[0x27] = (char16)IR::Opnd::GetValueType(&register0x00000000->super_Opnd);
  bVar3 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar3) ||
       ((bVar3 = DoTypedArrayTypeSpec(this), !bVar3 &&
        (bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)(debugStringBuffer + 0x27)),
        bVar3)))) ||
      ((bVar3 = DoNativeArrayTypeSpec(this), !bVar3 &&
       (bVar3 = ValueType::IsLikelyNativeArray((ValueType *)(debugStringBuffer + 0x27)), bVar3))))
     || ((bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)(debugStringBuffer + 0x27)),
         !bVar3 && (bVar3 = ValueType::IsLikelyNativeArray((ValueType *)(debugStringBuffer + 0x27)),
                   !bVar3)))) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
    if (bVar3) {
      Output::Print(L"TRACE ");
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
    if (bVar3) {
      ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])&sym);
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
      pcVar15 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      bVar3 = IR::Instr::DoStackArgsOpt(*pInstr);
      pcVar20 = 
      L"typed array type specialization is disabled, or base is not an optimized typed array";
      if (bVar3) {
        pcVar20 = L"instruction uses the arguments object";
      }
      Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"
                    ,pcVar13,pcVar14,pcVar15,&sym,pcVar20);
      Output::Flush();
    }
    return false;
  }
  pOVar10 = IR::Instr::GetSrc1(*pInstr);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar10);
  if (!bVar3) {
    if (src1Val != (Value *)0x0) {
      pVVar16 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::HasIntConstantValue(pVVar16,false);
      if (bVar3) goto LAB_005a4b0d;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2ae9,
                       "(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()))"
                       ,
                       "instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 0;
  }
LAB_005a4b0d:
  pOVar10 = IR::Instr::GetSrc1(*pInstr);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar10);
  if (bVar3) {
    pOVar10 = IR::Instr::GetSrc1(*pInstr);
    pRVar18 = IR::Opnd::AsRegOpnd(pOVar10);
    local_770 = pRVar18->m_sym;
  }
  else {
    local_770 = (StackSym *)0x0;
  }
  if (local_770 != (StackSym *)0x0) {
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)(debugStringBuffer + 0x27));
    if (bVar3) {
      pGVar19 = CurrentBlockData(this);
      bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar19,&local_770->super_Sym);
      if (!bVar3) {
        if (src1Val != (Value *)0x0) {
          bVar3 = DoAggressiveIntTypeSpec(this);
          if (bVar3) {
            pVVar16 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueType::IsLikelyInt(&pVVar16->super_ValueType);
          }
          else {
            pVVar16 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueType::IsInt(&pVVar16->super_ValueType);
          }
          if (bVar3) goto LAB_005a4e5e;
        }
        pGVar19 = CurrentBlockData(this);
        bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar19,&local_770->super_Sym);
        if (!bVar3) {
          if (src1Val == (Value *)0x0) {
            return false;
          }
          pVVar16 = ::Value::GetValueInfo(src1Val);
          bVar3 = ValueType::IsLikelyNumber(&pVVar16->super_ValueType);
          if (!bVar3) {
            return false;
          }
        }
        bVar3 = ValueType::HasIntElements((ValueType *)(debugStringBuffer + 0x27));
        if (bVar3) {
          return false;
        }
      }
    }
    else {
      pGVar19 = CurrentBlockData(this);
      bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar19,&local_770->super_Sym);
      if (!bVar3) {
        pGVar19 = CurrentBlockData(this);
        bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar19,&local_770->super_Sym);
        if (!bVar3) {
          uVar5 = Func::GetSourceContextId(this->func);
          uVar6 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
          if (bVar3) {
            Output::Print(L"TRACE ");
            bVar3 = IsLoopPrePass(this);
            if (bVar3) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            Output::Print(L"Didn\'t specialize array access, because src is not type specialized.\n"
                         );
            IR::Instr::Dump(*pInstr);
            Output::Flush();
          }
          uVar5 = Func::GetSourceContextId(this->func);
          uVar6 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6)
          ;
          if (bVar3) {
            ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])local_2f8);
            pJVar12 = Func::GetJITFunctionBody(this->func);
            pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
            pcVar14 = Func::GetDebugNumberSet
                                (this->func,(wchar (*) [42])(baseValueTypeStr_1 + 0xf8));
            pcVar15 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
            Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"
                          ,pcVar13,pcVar14,pcVar15,local_2f8);
            Output::Flush();
          }
          return false;
        }
      }
    }
  }
LAB_005a4e5e:
  bVar3 = ValueType::IsLikelyNativeIntArray((ValueType *)(debugStringBuffer + 0x27));
  if ((bVar3) && (src1Val != (Value *)0x0)) {
    pVVar16 = ::Value::GetValueInfo(src1Val);
    bVar3 = ValueInfo::TryGetIntConstantValue(pVVar16,(int32 *)((long)&dst + 4),false);
    if ((bVar3) &&
       (bVar3 = Js::SparseArraySegment<int>::IsMissingItem((int *)((long)&dst + 4)), bVar3)) {
      return false;
    }
  }
  pOVar10 = IR::Instr::GetDst(*pInstr);
  bVar3 = IR::Opnd::IsIndirOpnd(pOVar10);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2b2a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 0;
  }
  pOVar10 = IR::Instr::GetDst(*pInstr);
  pIVar11 = IR::Opnd::AsIndirOpnd(pOVar10);
  ToVarUses(this,*pInstr,&pIVar11->super_Opnd,true,(Value *)0x0);
  bVar3 = ShouldExpectConventionalArrayIndexValue(this,pIVar11);
  if (!bVar3) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
    if (bVar3) {
      Output::Print(L"TRACE ");
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t specialize array access, because index is negative or likely not int.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
    if (bVar3) {
      ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])&arrayBailOutKind)
      ;
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr_2 + 0xf8));
      pcVar15 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"
                    ,pcVar13,pcVar14,pcVar15,&arrayBailOutKind);
      Output::Flush();
    }
    return false;
  }
  local_469 = TyVar;
  local_46a = true;
  debugStringBuffer_3[0x28] = L'\x0f';
  debugStringBuffer_3[0x29] = L'\0';
  OVar4 = ValueType::GetObjectType((ValueType *)(debugStringBuffer + 0x27));
  switch(OVar4) {
  case Int8Array:
  case Uint8Array:
  case Int16Array:
  case Uint16Array:
  case Int32Array:
  case Int8VirtualArray:
  case Uint8VirtualArray:
  case Int16VirtualArray:
  case Uint16VirtualArray:
  case Int32VirtualArray:
  case Int8MixedArray:
  case Uint8MixedArray:
  case Int16MixedArray:
  case Uint16MixedArray:
  case Int32MixedArray:
    goto LAB_005a51aa;
  case Uint8ClampedArray:
  case Uint8ClampedVirtualArray:
  case Uint8ClampedMixedArray:
    if (local_770 != (StackSym *)0x0) {
      pGVar19 = CurrentBlockData(this);
      bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar19,&local_770->super_Sym);
      if (!bVar3) {
        pGVar19 = CurrentBlockData(this);
        bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar19,&local_770->super_Sym);
        if (bVar3) {
          local_469 = TyFloat64;
        }
        break;
      }
    }
    local_469 = TyInt32;
    local_46a = false;
    break;
  case Uint32Array:
  case Uint32VirtualArray:
  case Uint32MixedArray:
    if (local_770 != (StackSym *)0x0) {
      pGVar19 = CurrentBlockData(this);
      bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar19,&local_770->super_Sym);
      if (!bVar3) {
        pGVar19 = CurrentBlockData(this);
        bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar19,&local_770->super_Sym);
        if (bVar3) {
          local_469 = TyFloat64;
        }
        break;
      }
    }
    local_469 = TyInt32;
    break;
  case Float32Array:
  case Float64Array:
  case Float32VirtualArray:
  case Float64VirtualArray:
  case Float32MixedArray:
  case Float64MixedArray:
LAB_005a523d:
    bVar3 = DoFloatTypeSpec(this);
    if (bVar3) {
      local_469 = TyFloat64;
    }
    break;
  default:
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)(debugStringBuffer + 0x27));
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2b8f,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    local_46a = false;
    debugStringBuffer_3[0x28] = L'耀';
    debugStringBuffer_3[0x29] = L'\0';
    bVar3 = ValueType::HasIntElements((ValueType *)(debugStringBuffer + 0x27));
    if (!bVar3) {
      bVar3 = ValueType::HasFloatElements((ValueType *)(debugStringBuffer + 0x27));
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2b96,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
      goto LAB_005a523d;
    }
LAB_005a51aa:
    bVar3 = DoAggressiveIntTypeSpec(this);
    if ((bVar3) || (bVar3 = DoFloatTypeSpec(this), bVar3)) {
      local_469 = TyInt32;
    }
  }
  if (local_469 == TyVar) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
    if (bVar3) {
      Output::Print(L"TRACE ");
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t specialize array access, because the source was not already specialized.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
    if (bVar3) {
      ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])local_738);
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr_4 + 0xf8));
      pcVar15 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"
                    ,pcVar13,pcVar14,pcVar15,local_738);
      Output::Flush();
    }
    goto LAB_005a5b56;
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
  if (bVar3) {
    Output::Print(L"TRACE ");
    bVar3 = IsLoopPrePass(this);
    if (bVar3) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
  if (bVar3) {
    ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])local_5c8);
    pJVar12 = Func::GetJITFunctionBody(this->func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr_3 + 0xf8));
    pcVar15 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"
                  ,pcVar13,pcVar14,pcVar15,local_5c8);
    Output::Flush();
  }
  min = 2;
  if (local_469 == TyInt32) {
    min = 1;
  }
  pIVar1 = *pInstr;
  pOVar10 = IR::Instr::GetSrc1(*pInstr);
  ToTypeSpecUse(this,pIVar1,pOVar10,this->currentBlock,src1Val,(IndirOpnd *)0x0,local_469,min,
                local_46a,(Instr *)0x0);
  bVar3 = IsLoopPrePass(this);
  if (bVar3) goto LAB_005a5b56;
  max._3_1_ = 1;
  if (((*pInstr)->m_opcode == StElemC) &&
     (bVar3 = ValueType::IsObject((ValueType *)(debugStringBuffer + 0x27)), bVar3)) {
    bVar3 = ValueType::HasIntElements((ValueType *)(debugStringBuffer + 0x27));
    if (bVar3) {
      oldBailOutKind = LazyBailOut;
      local_5d8 = 0x7fffffff;
      pVVar16 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::GetIntValMinMax(pVVar16,(int *)&oldBailOutKind,&local_5d8,false);
      if (bVar3) {
        local_7c9 = (int)oldBailOutKind < -0x7fffd && -0x7ffff < local_5d8;
        max._3_1_ = local_7c9;
      }
    }
    else {
      max._3_1_ = 0;
    }
  }
  if ((max._3_1_ & 1) == 0) goto LAB_005a5b56;
  bVar3 = IR::Instr::HasBailOutInfo(*pInstr);
  if (!bVar3) {
    GenerateBailAtOperation(this,pInstr,debugStringBuffer_3._80_4_);
    goto LAB_005a5b56;
  }
  BVar7 = IR::Instr::GetBailOutKind(*pInstr);
  BVar8 = IR::operator~(BailOutKindBits);
  BVar8 = IR::operator&(BVar7,BVar8);
  bVar3 = IR::operator!(BVar8);
  if (bVar3) {
LAB_005a57b7:
    BVar8 = IR::operator&(BVar7,BailOutKindBits);
    BVar9 = IR::operator|(BailOutOnArrayAccessHelperCall,BailOutMarkTempObject);
    BVar9 = IR::operator~(BVar9);
    BVar8 = IR::operator&(BVar8,BVar9);
    bVar3 = IR::operator!(BVar8);
    if (!bVar3) goto LAB_005a57fb;
  }
  else {
    BVar8 = IR::operator~(BailOutKindBits);
    BVar8 = IR::operator&(BVar7,BVar8);
    if (BVar8 == BailOutOnImplicitCallsPreOp) goto LAB_005a57b7;
LAB_005a57fb:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2bcf,
                       "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                       ,
                       "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 0;
  }
  if (debugStringBuffer_3._80_4_ == 0xf) {
    pIVar1 = *pInstr;
    BVar8 = IR::operator-(BailOutKindBits,BailOutOnArrayAccessHelperCall);
    BVar7 = IR::operator&(BVar7,BVar8);
    BVar7 = IR::operator|(BailOutConventionalTypedArrayAccessOnly,BVar7);
    IR::Instr::SetBailOutKind(pIVar1,BVar7);
  }
  else {
    if (debugStringBuffer_3._80_4_ != 0x8000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2bdc,
                         "(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                         "arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pIVar1 = *pInstr;
    BVar7 = IR::operator|(BVar7,debugStringBuffer_3._80_4_);
    IR::Instr::SetBailOutKind(pIVar1,BVar7);
  }
LAB_005a5b56:
  return local_469 != TyVar;
}

Assistant:

bool
GlobOpt::TypeSpecializeStElem(IR::Instr ** pInstr, Value *src1Val, Value **pDstVal)
{
    IR::Instr *&instr = *pInstr;

    IR::RegOpnd *baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    ValueType baseValueType(baseOpnd->GetValueType());
    if (instr->DoStackArgsOpt() ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !(baseValueType.IsLikelyOptimizedTypedArray() || baseValueType.IsLikelyNativeArray()))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                instr->DoStackArgsOpt() ?
                    _u("instruction uses the arguments object") :
                    _u("typed array type specialization is disabled, or base is not an optimized typed array"));
            Output::Flush();
        }
        return false;
    }

    Assert(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()));

    StackSym *sym = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd()->m_sym : nullptr;

    // Only type specialize the source of store element if the source symbol is already type specialized to int or float.
    if (sym)
    {
        if (baseValueType.IsLikelyNativeArray())
        {
            // Gently coerce these src's into native if it seems likely to work.
            // Otherwise we can't use the fast path to store.
            // But don't try to put a float-specialized number into an int array this way.
            if (!(
                    CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
                    (
                        src1Val &&
                        (
                            DoAggressiveIntTypeSpec()
                                ? src1Val->GetValueInfo()->IsLikelyInt()
                                : src1Val->GetValueInfo()->IsInt()
                        )
                    )
                ))
            {
                if (!(
                        CurrentBlockData()->IsFloat64TypeSpecialized(sym) ||
                        (src1Val && src1Val->GetValueInfo()->IsLikelyNumber())
                    ) ||
                    baseValueType.HasIntElements())
                {
                    return false;
                }
            }
        }
        else if (!CurrentBlockData()->IsInt32TypeSpecialized(sym) && !CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because src is not type specialized.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"),
                              this->func->GetJITFunctionBody()->GetDisplayName(),
                              this->func->GetDebugNumberSet(debugStringBuffer),
                              Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                              baseValueTypeStr);
                Output::Flush();
            }

            return false;
        }
    }

    int32 src1IntConstantValue;
    if(baseValueType.IsLikelyNativeIntArray() && src1Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue))
    {
        if(Js::SparseArraySegment<int32>::IsMissingItem(&src1IntConstantValue))
        {
            return false;
        }
    }

    // Note: doing ToVarUses to make sure we do get the int32 version of the index before trying to access its value in
    // ShouldExpectConventionalArrayIndexValue. Not sure why that never gave us a problem before.
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();

    // Make sure we use the int32 version of the index operand symbol, if available.  Otherwise, ensure the var symbol is live (by
    // potentially inserting a ToVar).
    this->ToVarUses(instr, dst, /* isDst = */ true, nullptr);

    if (!ShouldExpectConventionalArrayIndexValue(dst))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because index is negative or likely not int.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
        return false;
    }

    IRType          toType = TyVar;
    bool            isLossyAllowed = true;
    IR::BailOutKind arrayBailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Uint8Array:
    case ObjectType::Int16Array:
    case ObjectType::Uint16Array:
    case ObjectType::Int32Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int8MixedArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Int16MixedArray:
    case ObjectType::Uint16MixedArray:
    case ObjectType::Int32MixedArray:
    Int32Array:
        if (this->DoAggressiveIntTypeSpec() || this->DoFloatTypeSpec())
        {
            toType = TyInt32;
        }
        break;

    case ObjectType::Uint32Array:
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
        // Uint32Arrays may store values that overflow int32.  If the value being stored comes from a symbol that's
        // already losslessly type specialized to int32, we'll use it.  Otherwise, if we only have a float64 specialized
        // value, we don't want to force bailout if it doesn't fit in int32.  Instead, we'll emit conversion in the
        // lowerer, and handle overflow, if necessary.
        if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
        {
            toType = TyInt32;
        }
        else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            toType = TyFloat64;
        }
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float64Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
    if (this->DoFloatTypeSpec())
    {
         toType = TyFloat64;
    }
    break;

    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        // Uint8ClampedArray requires rounding (as opposed to truncation) of floating point values. If source symbol is
        // float type specialized, type specialize this instruction to float as well, and handle rounding in the
        // lowerer.
            if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
            {
                toType = TyInt32;
                isLossyAllowed = false;
            }
            else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
            {
                toType = TyFloat64;
            }
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        isLossyAllowed = false;
        arrayBailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if (toType != TyVar)
    {
        GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                toType == TyInt32 ? _u("int32") : _u("float64"));
            Output::Flush();
        }

        IR::BailOutKind bailOutKind = ((toType == TyInt32) ? IR::BailOutIntOnly : IR::BailOutNumberOnly);
        this->ToTypeSpecUse(instr, instr->GetSrc1(), this->currentBlock, src1Val, nullptr, toType, bailOutKind, /* lossy = */ isLossyAllowed);

        if (!this->IsLoopPrePass())
        {
            bool bConvertToBailoutInstr = true;
            // Definite StElemC doesn't need bailout, because it can't fail or cause conversion.
            if (instr->m_opcode == Js::OpCode::StElemC && baseValueType.IsObject())
            {
                if (baseValueType.HasIntElements())
                {
                    //Native int array requires a missing element check & bailout
                    int32 min = INT32_MIN;
                    int32 max = INT32_MAX;

                    if (src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, false))
                    {
                        bConvertToBailoutInstr = ((min <= Js::JavascriptNativeIntArray::MissingItem) && (max >= Js::JavascriptNativeIntArray::MissingItem));
                    }
                }
                else
                {
                    bConvertToBailoutInstr = false;
                }
            }

            if (bConvertToBailoutInstr)
            {
                if(instr->HasBailOutInfo())
                {
                    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                    Assert(
                        (
                            !(oldBailOutKind & ~IR::BailOutKindBits) ||
                            (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                        !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                    if(arrayBailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                    {
                        // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                        // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                        // bails out for the right reason.
                        instr->SetBailOutKind(
                            arrayBailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                    }
                    else
                    {
                        // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                        // calls to occur, so it must be merged in to eliminate generating the helper call.
                        Assert(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                        instr->SetBailOutKind(oldBailOutKind | arrayBailOutKind);
                    }
                }
                else
                {
                    GenerateBailAtOperation(&instr, arrayBailOutKind);
                }
            }
        }
    }
    else
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because the source was not already specialized.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
    }

    return toType != TyVar;
}